

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_input_is_mouse_pressed(nk_input *i,nk_buttons id)

{
  nk_mouse_button *pnVar1;
  nk_mouse_button *b;
  nk_buttons id_local;
  nk_input *i_local;
  nk_bool local_4;
  
  if (i == (nk_input *)0x0) {
    local_4 = 0;
  }
  else {
    pnVar1 = (i->mouse).buttons + id;
    if ((pnVar1->down == 0) || (pnVar1->clicked == 0)) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_input_is_mouse_pressed(const struct nk_input *i, enum nk_buttons id)
{
const struct nk_mouse_button *b;
if (!i) return nk_false;
b = &i->mouse.buttons[id];
if (b->down && b->clicked)
return nk_true;
return nk_false;
}